

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void destroy_free<warm_cb>(void *temp)

{
  warm_cb::~warm_cb((warm_cb *)temp);
  free(temp);
  return;
}

Assistant:

void destroy_free(void* temp)
{
  ((T*)temp)->~T();
  free(temp);
}